

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraClass.c
# Opt level: O1

void Fra_ClassesTest(Fra_Cla_t *p,int Id1,int Id2)

{
  uint uVar1;
  Aig_Man_t *pAVar2;
  Vec_Ptr_t *pVVar3;
  Aig_Obj_t *pAVar4;
  Aig_Obj_t **ppAVar5;
  void **ppvVar6;
  Aig_Obj_t *pAVar7;
  int iVar8;
  
  ppAVar5 = (Aig_Obj_t **)malloc(0x20);
  p->pMemClasses = ppAVar5;
  if (Id2 <= Id1) {
    __assert_fail("Id1 < Id2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/fra/fraClass.c"
                  ,0x253,"void Fra_ClassesTest(Fra_Cla_t *, int, int)");
  }
  pAVar2 = p->pAig;
  pVVar3 = pAVar2->vObjs;
  if (pVVar3 == (Vec_Ptr_t *)0x0) {
    pAVar7 = (Aig_Obj_t *)0x0;
  }
  else {
    if ((Id1 < 0) || (pVVar3->nSize <= Id1)) goto LAB_00901b2d;
    pAVar7 = (Aig_Obj_t *)pVVar3->pArray[(uint)Id1];
  }
  *ppAVar5 = pAVar7;
  if ((Id2 < 0) || (pVVar3 = pAVar2->vObjs, pVVar3->nSize <= Id2)) {
LAB_00901b2d:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                  ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
  }
  pAVar4 = (Aig_Obj_t *)pVVar3->pArray[(uint)Id2];
  ppAVar5[1] = pAVar4;
  ppAVar5[2] = (Aig_Obj_t *)0x0;
  ppAVar5[3] = (Aig_Obj_t *)0x0;
  *(Aig_Obj_t **)
   (*(long *)(*(long *)((long)(pAVar4->field_5).pData + 0x30) + 8) + (long)pAVar4->Id * 8) = pAVar7;
  pVVar3 = p->vClasses;
  uVar1 = pVVar3->nCap;
  if (pVVar3->nSize == uVar1) {
    if ((int)uVar1 < 0x10) {
      if (pVVar3->pArray == (void **)0x0) {
        ppvVar6 = (void **)malloc(0x80);
      }
      else {
        ppvVar6 = (void **)realloc(pVVar3->pArray,0x80);
      }
      pVVar3->pArray = ppvVar6;
      iVar8 = 0x10;
    }
    else {
      iVar8 = uVar1 * 2;
      if (iVar8 <= (int)uVar1) goto LAB_00901b0f;
      if (pVVar3->pArray == (void **)0x0) {
        ppvVar6 = (void **)malloc((ulong)uVar1 << 4);
      }
      else {
        ppvVar6 = (void **)realloc(pVVar3->pArray,(ulong)uVar1 << 4);
      }
      pVVar3->pArray = ppvVar6;
    }
    pVVar3->nCap = iVar8;
  }
LAB_00901b0f:
  iVar8 = pVVar3->nSize;
  pVVar3->nSize = iVar8 + 1;
  pVVar3->pArray[iVar8] = ppAVar5;
  return;
}

Assistant:

void Fra_ClassesTest( Fra_Cla_t * p, int Id1, int Id2 )
{
    Aig_Obj_t ** pClass;
    p->pMemClasses = ABC_ALLOC( Aig_Obj_t *, 4 );
    pClass = p->pMemClasses;
    assert( Id1 < Id2 );
    pClass[0] = Aig_ManObj( p->pAig, Id1 );
    pClass[1] = Aig_ManObj( p->pAig, Id2 );
    pClass[2] = NULL;
    pClass[3] = NULL;
    Fra_ClassObjSetRepr( pClass[1], pClass[0] );
    Vec_PtrPush( p->vClasses, pClass );
}